

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_additive_expr(lyxp_expr *exp,uint16_t *exp_idx,uint16_t repeat,lyd_node *cur_node,
                      lys_module *param_5,lyxp_set *set,int options)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ushort local_ca;
  undefined1 local_c8 [6];
  uint16_t i;
  lyxp_set set2;
  lyxp_set orig_set;
  int local_3c;
  uint16_t this_op;
  int ret;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t repeat_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  if (repeat == 0) {
    __assert_fail("repeat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x1f24,
                  "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                 );
  }
  memset(&set2.field_0x38,0,0x40);
  memset(local_c8,0,0x40);
  set_fill_set((lyxp_set *)&set2.field_0x38,set);
  local_3c = eval_expr_select(exp,exp_idx,LYXP_EXPR_ADDITIVE,cur_node,param_5,set,options);
  if (local_3c == 0) {
    for (local_ca = 0; local_ca < repeat; local_ca = local_ca + 1) {
      uVar1 = *exp_idx;
      if (exp->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_MATH) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1f34,
                      "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      pcVar3 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar3 = "parsed";
      }
      pcVar4 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_additive_expr",pcVar3,pcVar4);
      *exp_idx = *exp_idx + 1;
      if (set == (lyxp_set *)0x0) {
        local_3c = eval_expr_select(exp,exp_idx,LYXP_EXPR_ADDITIVE,cur_node,param_5,(lyxp_set *)0x0,
                                    options);
        iVar2 = local_3c;
joined_r0x001b5ba9:
        if (iVar2 != 0) break;
      }
      else {
        set_fill_set((lyxp_set *)local_c8,(lyxp_set *)&set2.field_0x38);
        local_3c = eval_expr_select(exp,exp_idx,LYXP_EXPR_ADDITIVE,cur_node,param_5,
                                    (lyxp_set *)local_c8,options);
        if (local_3c != 0) break;
        if ((options & 0x1cU) == 0) {
          iVar2 = moveto_op_math(set,(lyxp_set *)local_c8,exp->expr + exp->expr_pos[uVar1],cur_node,
                                 param_5,options);
          goto joined_r0x001b5ba9;
        }
        warn_operands(param_5->ctx,set,(lyxp_set *)local_c8,1,exp->expr,
                      exp->expr_pos[(int)(uVar1 - 1)]);
        set_snode_merge(set,(lyxp_set *)local_c8);
        set_snode_clear_ctx(set);
      }
    }
  }
  lyxp_set_cast((lyxp_set *)&set2.field_0x38,LYXP_SET_EMPTY,cur_node,param_5,options);
  lyxp_set_cast((lyxp_set *)local_c8,LYXP_SET_EMPTY,cur_node,param_5,options);
  return local_3c;
}

Assistant:

static int
eval_additive_expr(struct lyxp_expr *exp, uint16_t *exp_idx, uint16_t repeat, struct lyd_node *cur_node,
                   struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    uint16_t this_op;
    struct lyxp_set orig_set, set2;
    uint16_t i;

    assert(repeat);

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    set_fill_set(&orig_set, set);

    ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_ADDITIVE, cur_node, local_mod, set, options);
    if (ret) {
        goto finish;
    }

    /* ('+' / '-' MultiplicativeExpr)* */
    for (i = 0; i < repeat; ++i) {
        this_op = *exp_idx;

        assert(exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH);
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        if (!set) {
            ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_ADDITIVE, cur_node, local_mod, NULL, options);
            if (ret) {
                goto finish;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_ADDITIVE, cur_node, local_mod, &set2, options);
        if (ret) {
            goto finish;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            warn_operands(local_mod->ctx, set, &set2, 1, exp->expr, exp->expr_pos[this_op - 1]);
            set_snode_merge(set, &set2);
            set_snode_clear_ctx(set);
        } else {
            if (moveto_op_math(set, &set2, &exp->expr[exp->expr_pos[this_op]], cur_node, local_mod, options)) {
                goto finish;
            }
        }
    }

finish:
    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return ret;
}